

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O2

char16 * Js::JavascriptObject::ConstructName
                   (PropertyRecord *propertyRecord,char16 *getOrSetStr,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *this;
  char16_t *_Dst;
  size_t sVar4;
  ulong uVar5;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  if (propertyRecord == (PropertyRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x829,"(propertyRecord)","propertyRecord");
    if (!bVar2) goto LAB_00b945ed;
    *puVar3 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x82a,"(scriptContext)","scriptContext");
    if (!bVar2) goto LAB_00b945ed;
    *puVar3 = 0;
  }
  if (propertyRecord->byteCount < 2) {
    _Dst = (char16_t *)0x0;
  }
  else {
    uVar5 = (ulong)(propertyRecord->byteCount >> 1);
    sVar4 = uVar5 + 5;
    local_60 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_7928bbe;
    data.filename._0_4_ = 0x832;
    data.plusSize = sVar4;
    this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
    _Dst = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                     ((Memory *)this,(Recycler *)Memory::Recycler::AllocLeafZero,0,sVar4);
    if (_Dst == (char16_t *)0x0) {
      AssertCount = AssertCount + 1;
      data._32_8_ = getOrSetStr;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x833,"(finalName != nullptr)","finalName != nullptr");
      if (!bVar2) goto LAB_00b945ed;
      *puVar3 = 0;
      getOrSetStr = (char16 *)data._32_8_;
    }
    wcscpy_s(_Dst,sVar4,(WCHAR *)(propertyRecord + 1));
    if (getOrSetStr == (char16_t *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x838,"(getOrSetStr != nullptr)","getOrSetStr != nullptr");
      if (!bVar2) goto LAB_00b945ed;
      *puVar3 = 0;
    }
    sVar4 = PAL_wcslen(getOrSetStr);
    if (sVar4 != 4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x839,"(PAL_wcslen(getOrSetStr) == 4)","wcslen(getOrSetStr) == 4"
                                 );
      if (!bVar2) {
LAB_00b945ed:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    wcscpy_s(_Dst + uVar5,5,getOrSetStr);
  }
  return _Dst;
}

Assistant:

char16 * JavascriptObject::ConstructName(const PropertyRecord * propertyRecord, const char16 * getOrSetStr, ScriptContext* scriptContext)
{
    Assert(propertyRecord);
    Assert(scriptContext);
    char16 * finalName = nullptr;
    size_t propertyLength = (size_t)propertyRecord->GetLength();
    if (propertyLength > 0)
    {
        size_t totalChars;
        if (SizeTAdd(propertyLength, ConstructNameGetSetLength, &totalChars) == S_OK)
        {
            finalName = RecyclerNewArrayLeafZ(scriptContext->GetRecycler(), char16, totalChars);
            Assert(finalName != nullptr);
            const char16* propertyName = propertyRecord->GetBuffer();
            Assert(propertyName != nullptr);
            wcscpy_s(finalName, totalChars, propertyName);

            Assert(getOrSetStr != nullptr);
            Assert(wcslen(getOrSetStr) == 4);

            wcscpy_s(finalName + propertyLength, ConstructNameGetSetLength, getOrSetStr);
        }
    }
    return finalName;
}